

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImBezierCubicClosestPoint
                 (ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,ImVec2 *p,int num_segments)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImVec2 p_last;
  ImVec2 p_current;
  
  iVar4 = 0;
  if (0 < num_segments) {
    iVar4 = num_segments;
  }
  fVar6 = 0.0;
  fVar7 = 0.0;
  fVar8 = 3.4028235e+38;
  p_last = *p1;
  for (iVar5 = 1; iVar5 - iVar4 != 1; iVar5 = iVar5 + 1) {
    IVar1 = ImBezierCubicCalc(p1,p2,p3,p4,(float)iVar5 * (1.0 / (float)num_segments));
    p_current = IVar1;
    IVar2 = ImLineClosestPoint(&p_last,&p_current,p);
    fVar9 = p->x - IVar2.x;
    fVar10 = p->y - IVar2.y;
    fVar9 = fVar9 * fVar9 + fVar10 * fVar10;
    fVar10 = IVar2.y;
    fVar3 = IVar2.x;
    if (fVar8 <= fVar9) {
      fVar9 = fVar8;
      fVar10 = fVar7;
      fVar3 = fVar6;
    }
    fVar6 = fVar3;
    fVar7 = fVar10;
    fVar8 = fVar9;
    p_last = IVar1;
  }
  IVar1.y = fVar7;
  IVar1.x = fVar6;
  return IVar1;
}

Assistant:

ImVec2 ImBezierCubicClosestPoint(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, const ImVec2& p, int num_segments)
{
    IM_ASSERT(num_segments > 0); // Use ImBezierCubicClosestPointCasteljau()
    ImVec2 p_last = p1;
    ImVec2 p_closest;
    float p_closest_dist2 = FLT_MAX;
    float t_step = 1.0f / (float)num_segments;
    for (int i_step = 1; i_step <= num_segments; i_step++)
    {
        ImVec2 p_current = ImBezierCubicCalc(p1, p2, p3, p4, t_step * i_step);
        ImVec2 p_line = ImLineClosestPoint(p_last, p_current, p);
        float dist2 = ImLengthSqr(p - p_line);
        if (dist2 < p_closest_dist2)
        {
            p_closest = p_line;
            p_closest_dist2 = dist2;
        }
        p_last = p_current;
    }
    return p_closest;
}